

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_blend.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  void *this;
  undefined1 local_198 [8];
  BlendBenchWindow surface;
  SDLBackend backend;
  allocator local_41;
  string local_40 [8];
  string arg;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  for (local_1c = 0; local_1c < argc; local_1c = local_1c + 1) {
    pcVar1 = argv[local_1c];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar1,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if ((local_1c + 1 < argc) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"--count"), bVar2)) {
      local_1c = local_1c + 1;
      nodeCount = atoi(argv[local_1c]);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"--textures");
      if (bVar2) {
        useTextures = true;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"-h");
        if ((bVar2) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"--help"), bVar2)) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<(poVar3," > ");
          poVar3 = std::operator<<(poVar3,*argv);
          poVar3 = std::operator<<(poVar3," [options]");
          this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<(poVar3,"Options:");
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<(poVar3,"  --count [x]      Number of layers");
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<(poVar3,"  --textures       Use textures rather than solid fills")
          ;
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    std::__cxx11::string::~string(local_40);
  }
  rengine::SDLBackend::SDLBackend
            ((SDLBackend *)
             &surface.m_pendingJobs.
              super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
              ._M_impl._M_node._M_size);
  BlendBenchWindow::BlendBenchWindow((BlendBenchWindow *)local_198);
  rengine::Surface::show((Surface *)local_198);
  rengine::Backend::run
            ((Backend *)
             &surface.m_pendingJobs.
              super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
              ._M_impl._M_node._M_size);
  BlendBenchWindow::~BlendBenchWindow((BlendBenchWindow *)local_198);
  rengine::SDLBackend::~SDLBackend
            ((SDLBackend *)
             &surface.m_pendingJobs.
              super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
              ._M_impl._M_node._M_size);
  return 0;
}

Assistant:

RENGINE_DEFINE_GLOBALS

int main(int argc, char **argv) {

    for (int i=0; i<argc; ++i) {
        std::string arg(argv[i]);
        if (i + 1 < argc && arg == "--count") {
            nodeCount = atoi(argv[++i]);
        } else if (arg == "--textures") {
            useTextures = true;
        } else if (arg == "-h" || arg == "--help") {
            cout << "Usage: " << endl
                 << " > " << argv[0] << " [options]" << endl
                 << endl
                 << "Options:" << endl
                 << "  --count [x]      Number of layers" << endl
                 << "  --textures       Use textures rather than solid fills" << endl;
        }
    }

    RENGINE_BACKEND backend;

    BlendBenchWindow surface;
    surface.show();

    backend.run();

    return 0;
}